

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

MainHeader * duckdb::MainHeader::Read(MainHeader *__return_storage_ptr__,ReadStream *source)

{
  duckdb *this;
  unsigned_long uVar1;
  IOException *pIVar2;
  idx_t version_number;
  char *__rhs;
  idx_t i;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_10a;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  data_t magic_bytes [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string version_text;
  string version;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (**source->_vptr_ReadStream)(source,magic_bytes,4);
  if (magic_bytes != (data_t  [4])0x4b435544) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&version,"The file is not a valid DuckDB database file!",
               (allocator *)&version_text);
    IOException::IOException(pIVar2,&version);
    __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this = (duckdb *)ReadStream::Read<unsigned_long>(source);
  __return_storage_ptr__->version_number = (uint64_t)this;
  if ((duckdb *)0xfffffffffffffffc < this + -0x43) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      uVar1 = ReadStream::Read<unsigned_long>(source);
      __return_storage_ptr__->flags[lVar3] = uVar1;
    }
    __return_storage_ptr__->library_git_desc[0x10] = '\0';
    __return_storage_ptr__->library_git_desc[0x11] = '\0';
    __return_storage_ptr__->library_git_desc[0x12] = '\0';
    __return_storage_ptr__->library_git_desc[0x13] = '\0';
    __return_storage_ptr__->library_git_desc[0x14] = '\0';
    __return_storage_ptr__->library_git_desc[0x15] = '\0';
    __return_storage_ptr__->library_git_desc[0x16] = '\0';
    __return_storage_ptr__->library_git_desc[0x17] = '\0';
    __return_storage_ptr__->library_git_desc[0x18] = '\0';
    __return_storage_ptr__->library_git_desc[0x19] = '\0';
    __return_storage_ptr__->library_git_desc[0x1a] = '\0';
    __return_storage_ptr__->library_git_desc[0x1b] = '\0';
    __return_storage_ptr__->library_git_desc[0x1c] = '\0';
    __return_storage_ptr__->library_git_desc[0x1d] = '\0';
    __return_storage_ptr__->library_git_desc[0x1e] = '\0';
    __return_storage_ptr__->library_git_desc[0x1f] = '\0';
    __return_storage_ptr__->library_git_desc[0] = '\0';
    __return_storage_ptr__->library_git_desc[1] = '\0';
    __return_storage_ptr__->library_git_desc[2] = '\0';
    __return_storage_ptr__->library_git_desc[3] = '\0';
    __return_storage_ptr__->library_git_desc[4] = '\0';
    __return_storage_ptr__->library_git_desc[5] = '\0';
    __return_storage_ptr__->library_git_desc[6] = '\0';
    __return_storage_ptr__->library_git_desc[7] = '\0';
    __return_storage_ptr__->library_git_desc[8] = '\0';
    __return_storage_ptr__->library_git_desc[9] = '\0';
    __return_storage_ptr__->library_git_desc[10] = '\0';
    __return_storage_ptr__->library_git_desc[0xb] = '\0';
    __return_storage_ptr__->library_git_desc[0xc] = '\0';
    __return_storage_ptr__->library_git_desc[0xd] = '\0';
    __return_storage_ptr__->library_git_desc[0xe] = '\0';
    __return_storage_ptr__->library_git_desc[0xf] = '\0';
    (**source->_vptr_ReadStream)(source,__return_storage_ptr__->library_git_desc,0x20);
    __return_storage_ptr__->library_git_hash[0x10] = '\0';
    __return_storage_ptr__->library_git_hash[0x11] = '\0';
    __return_storage_ptr__->library_git_hash[0x12] = '\0';
    __return_storage_ptr__->library_git_hash[0x13] = '\0';
    __return_storage_ptr__->library_git_hash[0x14] = '\0';
    __return_storage_ptr__->library_git_hash[0x15] = '\0';
    __return_storage_ptr__->library_git_hash[0x16] = '\0';
    __return_storage_ptr__->library_git_hash[0x17] = '\0';
    __return_storage_ptr__->library_git_hash[0x18] = '\0';
    __return_storage_ptr__->library_git_hash[0x19] = '\0';
    __return_storage_ptr__->library_git_hash[0x1a] = '\0';
    __return_storage_ptr__->library_git_hash[0x1b] = '\0';
    __return_storage_ptr__->library_git_hash[0x1c] = '\0';
    __return_storage_ptr__->library_git_hash[0x1d] = '\0';
    __return_storage_ptr__->library_git_hash[0x1e] = '\0';
    __return_storage_ptr__->library_git_hash[0x1f] = '\0';
    __return_storage_ptr__->library_git_hash[0] = '\0';
    __return_storage_ptr__->library_git_hash[1] = '\0';
    __return_storage_ptr__->library_git_hash[2] = '\0';
    __return_storage_ptr__->library_git_hash[3] = '\0';
    __return_storage_ptr__->library_git_hash[4] = '\0';
    __return_storage_ptr__->library_git_hash[5] = '\0';
    __return_storage_ptr__->library_git_hash[6] = '\0';
    __return_storage_ptr__->library_git_hash[7] = '\0';
    __return_storage_ptr__->library_git_hash[8] = '\0';
    __return_storage_ptr__->library_git_hash[9] = '\0';
    __return_storage_ptr__->library_git_hash[10] = '\0';
    __return_storage_ptr__->library_git_hash[0xb] = '\0';
    __return_storage_ptr__->library_git_hash[0xc] = '\0';
    __return_storage_ptr__->library_git_hash[0xd] = '\0';
    __return_storage_ptr__->library_git_hash[0xe] = '\0';
    __return_storage_ptr__->library_git_hash[0xf] = '\0';
    (**source->_vptr_ReadStream)(source,__return_storage_ptr__->library_git_hash,0x20);
    return __return_storage_ptr__;
  }
  GetDuckDBVersion_abi_cxx11_(&version,this,version_number);
  version_text._M_dataplus._M_p = (pointer)&version_text.field_2;
  version_text._M_string_length = 0;
  version_text.field_2._M_local_buf[0] = '\0';
  if (version._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)&local_60,"an ",&local_109);
    __rhs = "newer";
    if (this < (duckdb *)0x42) {
      __rhs = "older development";
    }
    ::std::operator+(&local_108,&local_60,__rhs);
    ::std::__cxx11::string::string((string *)&local_80," version of DuckDB",&local_10a);
    ::std::operator+(&local_e0,&local_108,&local_80);
    ::std::__cxx11::string::operator=((string *)&version_text,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_108);
    this_00 = &local_60;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_108,(string *)&version);
    ::std::operator+(&local_e0,"DuckDB version ",&local_108);
    ::std::__cxx11::string::operator=((string *)&version_text,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    this_00 = &local_108;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_e0,
             "Trying to read a database file with version number %lld, but we can only read versions between %lld and %lld.\nThe database file was created with %s.\n\nNewer DuckDB version might introduce backward incompatible changes (possibly guarded by compatibility settings)See the storage page for migration strategy and more information: https://duckdb.org/internals/storage"
             ,(allocator *)&local_108);
  ::std::__cxx11::string::string((string *)&local_40,(string *)&version_text);
  IOException::IOException<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
            (pIVar2,&local_e0,(unsigned_long)this,0x40,0x42,&local_40);
  __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

MainHeader MainHeader::Read(ReadStream &source) {
	data_t magic_bytes[MAGIC_BYTE_SIZE];
	MainHeader header;
	source.ReadData(magic_bytes, MainHeader::MAGIC_BYTE_SIZE);
	if (memcmp(magic_bytes, MainHeader::MAGIC_BYTES, MainHeader::MAGIC_BYTE_SIZE) != 0) {
		throw IOException("The file is not a valid DuckDB database file!");
	}
	header.version_number = source.Read<uint64_t>();
	// check the version number
	if (header.version_number < VERSION_NUMBER_LOWER || header.version_number > VERSION_NUMBER_UPPER) {
		auto version = GetDuckDBVersion(header.version_number);
		string version_text;
		if (!version.empty()) {
			// known version
			version_text = "DuckDB version " + string(version);
		} else {
			version_text = string("an ") +
			               (VERSION_NUMBER_UPPER > header.version_number ? "older development" : "newer") +
			               string(" version of DuckDB");
		}
		throw IOException(
		    "Trying to read a database file with version number %lld, but we can only read versions between %lld and "
		    "%lld.\n"
		    "The database file was created with %s.\n\n"
		    "Newer DuckDB version might introduce backward incompatible changes (possibly guarded by compatibility "
		    "settings)"
		    "See the storage page for migration strategy and more information: https://duckdb.org/internals/storage",
		    header.version_number, VERSION_NUMBER_LOWER, VERSION_NUMBER_UPPER, version_text);
	}
	// read the flags
	for (idx_t i = 0; i < FLAG_COUNT; i++) {
		header.flags[i] = source.Read<uint64_t>();
	}

	DeserializeVersionNumber(source, header.library_git_desc);
	DeserializeVersionNumber(source, header.library_git_hash);
	return header;
}